

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

int Gem_FuncCheckMajority(Gem_Man_t *p,int f)

{
  int iVar1;
  Vec_Mem_t *pVVar2;
  Gem_Obj_t *pGVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  sbyte sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int m;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int Polar;
  uint local_1c;
  
  if ((-1 < f) && (pVVar2 = p->vTtMem, f < pVVar2->nEntries)) {
    pGVar3 = p->pObjs;
    uVar10 = *(uint *)(pGVar3 + f) & 0xf;
    iVar1 = uVar10 - 1;
    auVar16._4_4_ = iVar1;
    auVar16._0_4_ = iVar1;
    auVar16._8_4_ = iVar1;
    auVar16._12_4_ = iVar1;
    uVar11 = 0;
    auVar16 = auVar16 ^ _DAT_0093d220;
    local_1c = 0;
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      bVar15 = (pVVar2->ppPages[(uint)f >> ((byte)pVVar2->LogPageSze & 0x1f)]
                [(long)(f & pVVar2->PageMask) * (long)pVVar2->nEntrySize + (uVar13 >> 6)] >>
                (uVar13 & 0x3f) & 1) != 0;
      uVar9 = 0;
      if (uVar10 != 0) {
        auVar23 = (undefined1  [16])0x0;
        auVar19 = _DAT_0094a000;
        uVar9 = uVar10 + 3 & 0xfffffffc;
        do {
          auVar17 = auVar19;
          auVar18 = auVar23;
          auVar19 = pshuflw(auVar18,auVar17,0xfe);
          auVar22 = pshuflw(in_XMM11,auVar17,0x54);
          auVar21._0_8_ = auVar17._8_8_;
          auVar21._8_4_ = auVar17._8_4_;
          auVar21._12_4_ = auVar17._12_4_;
          auVar23 = pshuflw(auVar22,auVar21,0xfe);
          auVar4._4_4_ = uVar12;
          auVar4._0_4_ = uVar12;
          auVar4._8_4_ = uVar12;
          auVar4._12_4_ = uVar12;
          lVar20 = auVar23._0_8_;
          auVar6._4_8_ = auVar4._8_8_;
          auVar6._0_4_ = uVar12 >> lVar20;
          auVar25._0_8_ = auVar6._0_8_ << 0x20;
          auVar25._8_4_ = uVar12 >> lVar20;
          auVar25._12_4_ = uVar12 >> lVar20;
          auVar23 = pshuflw(auVar21,auVar21,0x54);
          auVar5._4_4_ = uVar12;
          auVar5._0_4_ = uVar12;
          auVar5._8_4_ = uVar12;
          auVar5._12_4_ = uVar12;
          lVar20 = auVar23._0_8_;
          auVar7._4_8_ = auVar5._8_8_;
          auVar7._0_4_ = uVar12 >> lVar20;
          auVar24._0_8_ = auVar7._0_8_ << 0x20;
          auVar24._8_4_ = uVar12 >> lVar20;
          auVar24._12_4_ = uVar12 >> lVar20;
          in_XMM11._8_8_ = auVar25._8_8_;
          in_XMM11._0_8_ = auVar24._8_8_;
          auVar23._0_4_ = (uVar12 >> auVar22._0_8_ & 1) + auVar18._0_4_;
          auVar23._4_4_ = (uVar12 >> auVar19._0_8_ & 1) + auVar18._4_4_;
          auVar23._8_4_ = (auVar24._8_4_ & 1) + auVar18._8_4_;
          auVar23._12_4_ = (auVar25._12_4_ & 1) + auVar18._12_4_;
          auVar19._0_4_ = auVar17._0_4_ + (int)DAT_0094a040;
          auVar19._4_4_ = auVar17._4_4_ + DAT_0094a040._4_4_;
          auVar19._8_4_ = auVar17._8_4_ + DAT_0094a040._8_4_;
          auVar19._12_4_ = auVar17._12_4_ + DAT_0094a040._12_4_;
          uVar9 = uVar9 - 4;
        } while (uVar9 != 0);
        auVar17 = auVar17 ^ _DAT_0093d220;
        auVar22._0_4_ = -(uint)(auVar16._0_4_ < auVar17._0_4_);
        auVar22._4_4_ = -(uint)(auVar16._4_4_ < auVar17._4_4_);
        auVar22._8_4_ = -(uint)(auVar16._8_4_ < auVar17._8_4_);
        auVar22._12_4_ = -(uint)(auVar16._12_4_ < auVar17._12_4_);
        auVar23 = ~auVar22 & auVar23 | auVar18 & auVar22;
        uVar9 = auVar23._12_4_ + auVar23._4_4_ + auVar23._8_4_ + auVar23._0_4_;
      }
      uVar14 = 1 << ((byte)uVar9 & 0x1f);
      if ((uVar11 >> (uVar9 & 0x1f) & 1) == 0) {
        uVar11 = uVar11 | uVar14;
        if (!bVar15) {
          uVar14 = 0;
        }
        local_1c = local_1c | uVar14;
      }
      else if (bVar15 != ((local_1c >> (uVar9 & 0x1f) & 1) != 0)) {
        return 0;
      }
      uVar13 = (ulong)(uVar12 + 1);
    } while (uVar12 + 1 >> (sbyte)uVar10 == 0);
    if (local_1c != 0xffffffff) {
      printf("Found symmetric %d-variable function: ",(ulong)uVar10);
      Extra_PrintBinary2(_stdout,&local_1c,(*(uint *)(pGVar3 + f) & 0xf) + 1);
      printf("   ");
      if (((*(uint *)(pGVar3 + f) & 1) == 0) ||
         (sVar8 = (sbyte)(uVar10 + 1 >> 1),
         local_1c != (int)(0xffffffffffffffff >> (-sVar8 & 0x3fU)) << sVar8)) {
        putchar(10);
      }
      else {
        printf("This is majority-%d.\n",(ulong)(*(uint *)(pGVar3 + f) & 0xf));
      }
    }
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
}

Assistant:

int Gem_FuncCheckMajority( Gem_Man_t * p, int f )
{
    Gem_Obj_t * pObj = p->pObjs + f;
    word * pTruth = Vec_MemReadEntry( p->vTtMem, f );
    int Polar = Abc_TtIsFullySymmetric( pTruth, pObj->nVars );
    if ( Polar != -1 )
    {
        int nHalfVars = (pObj->nVars+1) >> 1;
        int Mask = Abc_Tt6Mask( nHalfVars );
        printf( "Found symmetric %d-variable function: ", pObj->nVars );
        Extra_PrintBinary2( stdout, (unsigned *)&Polar, pObj->nVars + 1 );
        printf( "   " );
        if ( (pObj->nVars & 1) && Polar == (Mask << nHalfVars) )
        {
            printf( "This is majority-%d.\n", pObj->nVars );
            return 0;
        }
        printf( "\n" );
    }
    return 0;
}